

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::CheckDependencies
          (cmDepends *this,istream *internalDepends,string *internalDependsFileName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  char *pcVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *pmVar2;
  bool bVar3;
  long *plVar4;
  long lVar5;
  ostream *poVar6;
  allocator<char> local_5c1;
  key_type local_5c0;
  string local_5a0;
  undefined1 local_580 [8];
  ostringstream msg_2;
  int local_404;
  undefined1 local_400 [4];
  int result_1;
  undefined1 local_3e0 [8];
  ostringstream msg_1;
  int local_264;
  undefined1 local_260 [4];
  int result;
  undefined1 local_240 [8];
  ostringstream msg;
  allocator<char> local_c1;
  undefined1 local_c0 [8];
  string depender;
  undefined1 local_98 [8];
  string dependee;
  bool regenerate;
  allocator<char> local_61;
  key_type local_60;
  long local_40;
  size_t len;
  DependencyVector *currentDependencies;
  bool dependerExists;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *pmStack_28;
  bool okay;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  string *internalDependsFileName_local;
  istream *internalDepends_local;
  cmDepends *this_local;
  
  currentDependencies._7_1_ = 1;
  currentDependencies._6_1_ = 0;
  len = 0;
  pmStack_28 = validDeps;
  validDeps_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
        *)internalDependsFileName;
  internalDependsFileName_local = (string *)internalDepends;
  internalDepends_local = (istream *)this;
  while( true ) {
    plVar4 = (long *)std::istream::getline
                               ((char *)internalDependsFileName_local,(long)this->Dependee);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar3) break;
    if (((*this->Dependee != '\0') && (*this->Dependee != '#')) && (*this->Dependee != '\r')) {
      lVar5 = std::istream::gcount();
      local_40 = lVar5 + -1;
      if (this->Dependee[lVar5 + -2] == '\r') {
        local_40 = lVar5 + -2;
        this->Dependee[local_40] = '\0';
      }
      if (*this->Dependee == ' ') {
        dependee.field_2._M_local_buf[0xb] = '\0';
        pcVar1 = this->Dependee;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_98,pcVar1 + 1,
                   (allocator<char> *)(depender.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(depender.field_2._M_local_buf + 0xf));
        pcVar1 = this->Depender;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,pcVar1,&local_c1);
        std::allocator<char>::~allocator(&local_c1);
        if (len != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)len,(value_type *)local_98);
        }
        bVar3 = cmsys::SystemTools::FileExists((string *)local_98);
        if (bVar3) {
          if ((currentDependencies._6_1_ & 1) == 0) {
            local_404 = 0;
            bVar3 = cmFileTimeCache::Compare
                              (this->FileTimeCache,(string *)validDeps_local,(string *)local_98,
                               &local_404);
            if (((!bVar3) || (local_404 < 0)) &&
               (dependee.field_2._M_local_buf[0xb] = '\x01', (this->Verbose & 1U) != 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
              poVar6 = std::operator<<((ostream *)local_580,"Dependee \"");
              poVar6 = std::operator<<(poVar6,(string *)local_98);
              poVar6 = std::operator<<(poVar6,"\" is newer than depends file \"");
              poVar6 = std::operator<<(poVar6,(string *)validDeps_local);
              poVar6 = std::operator<<(poVar6,"\".");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout(&local_5a0);
              std::__cxx11::string::~string((string *)&local_5a0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
            }
          }
          else {
            local_264 = 0;
            bVar3 = cmFileTimeCache::Compare
                              (this->FileTimeCache,(string *)local_c0,(string *)local_98,&local_264)
            ;
            if (((!bVar3) || (local_264 < 0)) &&
               (dependee.field_2._M_local_buf[0xb] = '\x01', (this->Verbose & 1U) != 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
              poVar6 = std::operator<<((ostream *)local_3e0,"Dependee \"");
              poVar6 = std::operator<<(poVar6,(string *)local_98);
              poVar6 = std::operator<<(poVar6,"\" is newer than depender \"");
              poVar6 = std::operator<<(poVar6,(string *)local_c0);
              poVar6 = std::operator<<(poVar6,"\".");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::ostringstream::str();
              cmSystemTools::Stdout((string *)local_400);
              std::__cxx11::string::~string((string *)local_400);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
            }
          }
        }
        else {
          dependee.field_2._M_local_buf[0xb] = '\x01';
          if ((this->Verbose & 1U) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
            poVar6 = std::operator<<((ostream *)local_240,"Dependee \"");
            poVar6 = std::operator<<(poVar6,(string *)local_98);
            poVar6 = std::operator<<(poVar6,"\" does not exist for depender \"");
            poVar6 = std::operator<<(poVar6,(string *)local_c0);
            poVar6 = std::operator<<(poVar6,"\".");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            cmSystemTools::Stdout((string *)local_260);
            std::__cxx11::string::~string((string *)local_260);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
          }
        }
        pmVar2 = pmStack_28;
        if ((dependee.field_2._M_local_buf[0xb] & 1U) != 0) {
          currentDependencies._7_1_ = 0;
          if (len != 0) {
            pcVar1 = this->Depender;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_5c0,pcVar1,&local_5c1);
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
            ::erase(pmVar2,&local_5c0);
            std::__cxx11::string::~string((string *)&local_5c0);
            std::allocator<char>::~allocator(&local_5c1);
            len = 0;
          }
          if ((currentDependencies._6_1_ & 1) != 0) {
            cmsys::SystemTools::RemoveFile((string *)local_c0);
            currentDependencies._6_1_ = 0;
          }
        }
        std::__cxx11::string::~string((string *)local_c0);
        std::__cxx11::string::~string((string *)local_98);
      }
      else {
        memcpy(this->Depender,this->Dependee,local_40 + 1);
        currentDependencies._6_1_ = cmsys::SystemTools::FileExists(this->Depender);
        pmVar2 = pmStack_28;
        pcVar1 = this->Depender;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
        len = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                      ::operator[](pmVar2,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
    }
  }
  return (bool)(currentDependencies._7_1_ & 1);
}

Assistant:

bool cmDepends::CheckDependencies(
  std::istream& internalDepends, const std::string& internalDependsFileName,
  std::map<std::string, DependencyVector>& validDeps)
{
  // Parse dependencies from the stream.  If any dependee is missing
  // or newer than the depender then dependencies should be
  // regenerated.
  bool okay = true;
  bool dependerExists = false;
  DependencyVector* currentDependencies = nullptr;

  while (internalDepends.getline(this->Dependee, this->MaxPath)) {
    if (this->Dependee[0] == 0 || this->Dependee[0] == '#' ||
        this->Dependee[0] == '\r') {
      continue;
    }
    size_t len = internalDepends.gcount() - 1;
    if (this->Dependee[len - 1] == '\r') {
      len--;
      this->Dependee[len] = 0;
    }
    if (this->Dependee[0] != ' ') {
      memcpy(this->Depender, this->Dependee, len + 1);
      // Calling FileExists() for the depender here saves in many cases 50%
      // of the calls to FileExists() further down in the loop. E.g. for
      // kdelibs/khtml this reduces the number of calls from 184k down to 92k,
      // or the time for cmake -E cmake_depends from 0.3 s down to 0.21 s.
      dependerExists = cmSystemTools::FileExists(this->Depender);
      // If we erase validDeps[this->Depender] by overwriting it with an empty
      // vector, we lose dependencies for dependers that have multiple
      // entries. No need to initialize the entry, std::map will do so on first
      // access.
      currentDependencies = &validDeps[this->Depender];
      continue;
    }
    /*
    // Parse the dependency line.
    if(!this->ParseDependency(line.c_str()))
      {
      continue;
      }
      */

    // Dependencies must be regenerated
    // * if the dependee does not exist
    // * if the depender exists and is older than the dependee.
    // * if the depender does not exist, but the dependee is newer than the
    //   depends file
    bool regenerate = false;
    const std::string dependee(this->Dependee + 1);
    const std::string depender(this->Depender);
    if (currentDependencies != nullptr) {
      currentDependencies->push_back(dependee);
    }

    if (!cmSystemTools::FileExists(dependee)) {
      // The dependee does not exist.
      regenerate = true;

      // Print verbose output.
      if (this->Verbose) {
        std::ostringstream msg;
        msg << "Dependee \"" << dependee << "\" does not exist for depender \""
            << depender << "\"." << std::endl;
        cmSystemTools::Stdout(msg.str());
      }
    } else {
      if (dependerExists) {
        // The dependee and depender both exist.  Compare file times.
        int result = 0;
        if ((!this->FileTimeCache->Compare(depender, dependee, &result) ||
             result < 0)) {
          // The depender is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee << "\" is newer than depender \""
                << depender << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      } else {
        // The dependee exists, but the depender doesn't. Regenerate if the
        // internalDepends file is older than the dependee.
        int result = 0;
        if ((!this->FileTimeCache->Compare(internalDependsFileName, dependee,
                                           &result) ||
             result < 0)) {
          // The depends-file is older than the dependee.
          regenerate = true;

          // Print verbose output.
          if (this->Verbose) {
            std::ostringstream msg;
            msg << "Dependee \"" << dependee
                << "\" is newer than depends file \""
                << internalDependsFileName << "\"." << std::endl;
            cmSystemTools::Stdout(msg.str());
          }
        }
      }
    }
    if (regenerate) {
      // Dependencies must be regenerated.
      okay = false;

      // Remove the information of this depender from the map, it needs
      // to be rescanned
      if (currentDependencies != nullptr) {
        validDeps.erase(this->Depender);
        currentDependencies = nullptr;
      }

      // Remove the depender to be sure it is rebuilt.
      if (dependerExists) {
        cmSystemTools::RemoveFile(depender);
        dependerExists = false;
      }
    }
  }

  return okay;
}